

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O1

word Gia_ManAutomInit(Gia_Man_t *p)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  
  lVar4 = (long)p->nObjs;
  if (lVar4 < 1) {
    return 0;
  }
  uVar3 = 0;
  pGVar6 = p->pObjs;
  do {
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      return 0;
    }
    uVar1 = *(ulong *)pGVar6;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar1) {
      if (((((uint)uVar1 >> 0x1d & 1) != 0) &&
          (uVar2 = *(undefined8 *)
                    ((long)pGVar6 + (ulong)(uint)((int)(uVar1 & 0x1fffffff) << 2) * -3),
          ((uint)uVar2 & 0x9fffffff) == 0x9fffffff)) &&
         (iVar5 = (p->nRegs - p->vCis->nSize) + ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff),
         -1 < iVar5)) {
        uVar3 = uVar3 | 1L << ((ulong)(byte)(0x3f - (char)iVar5) & 0x3f);
      }
      if ((((uVar1 >> 0x3d & 1) != 0) &&
          (uVar2 = *(undefined8 *)((long)pGVar6 + (ulong)((uint)(uVar1 >> 0x1e) & 0x7ffffffc) * -3),
          ((uint)uVar2 & 0x9fffffff) == 0x9fffffff)) &&
         (iVar5 = (p->nRegs - p->vCis->nSize) + ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff),
         -1 < iVar5)) {
        uVar3 = uVar3 | 1L << ((ulong)(byte)(0x3f - (char)iVar5) & 0x3f);
      }
    }
    pGVar6 = pGVar6 + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  return uVar3;
}

Assistant:

word Gia_ManAutomInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Index;
    word Init = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjFaninC0(pObj) && Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
        {
            Index = Gia_ObjCioId(Gia_ObjFanin0(pObj)) - Gia_ManPiNum(p);
            if ( Index >= 0 )
                Init |= ((word)1 << (63-Index));
        }
        if ( Gia_ObjFaninC1(pObj) && Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
        {
            Index = Gia_ObjCioId(Gia_ObjFanin1(pObj)) - Gia_ManPiNum(p);
            if ( Index >= 0 )
                Init |= ((word)1 << (63-Index));
        }
    }
    return Init;
}